

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O0

ssize_t __thiscall
Text::splice(Text *this,int __fdin,__off64_t *__offin,int __fdout,__off64_t *__offout,size_t __len,
            uint __flags)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var1
  ;
  uint32_t uVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  size_type sVar7;
  Point PVar8;
  size_t sVar9;
  reference pvVar10;
  undefined7 extraout_var;
  reference puVar11;
  uint in_register_00000034;
  undefined4 in_stack_0000000c;
  uint in_stack_00000010;
  uint in_stack_00000018;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_c8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_c0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> iter;
  int64_t trailing_line_offsets_delta;
  ulong uStack_a0;
  uint32_t content_size;
  size_t i;
  int64_t inserted_line_offsets_delta;
  uint32_t inserted_newlines_end;
  uint32_t inserted_newlines_start;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_78;
  uint *local_70;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  const_iterator local_58;
  char16_t *local_50;
  const_iterator local_48;
  uint local_3c;
  Point PStack_38;
  uint32_t original_content_size;
  uint32_t local_30;
  Point PStack_2c;
  uint32_t content_splice_end;
  uint32_t local_24;
  Text *pTStack_20;
  uint32_t content_splice_start;
  Text *this_local;
  Point deletion_extent_local;
  Point start_local;
  
  PStack_2c.column = in_register_00000034;
  PStack_2c.row = __fdin;
  pTStack_20 = this;
  this_local = (Text *)__offin;
  deletion_extent_local = PStack_2c;
  local_24 = offset_for_position(this,PStack_2c);
  PStack_38 = Point::traverse(&deletion_extent_local,(Point *)&this_local);
  local_30 = offset_for_position(this,PStack_38);
  sVar7 = std::__cxx11::
          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::size
                    (&this->content);
  uVar2 = local_24;
  local_3c = (uint)sVar7;
  uVar4 = local_30 - local_24;
  local_48._M_current = (char16_t *)TextSlice::begin_abi_cxx11_((TextSlice *)&__flags);
  local_50 = (char16_t *)TextSlice::end_abi_cxx11_((TextSlice *)&__flags);
  splice_vector<std::__cxx11::u16string>
            (&this->content,uVar2,uVar4,local_48,(const_iterator)local_50);
  uVar4 = deletion_extent_local.row + 1;
  uVar2 = (uint32_t)this_local;
  local_68._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          (CONCAT44(in_stack_0000000c,__flags) + 0x20));
  local_60 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator+(&local_68,(ulong)in_stack_00000010);
  local_58._M_current =
       (uint *)__gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator+(&local_60,1);
  _inserted_newlines_end =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  (CONCAT44(in_stack_0000000c,__flags) + 0x20));
  local_78 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator+((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&inserted_newlines_end,(ulong)in_stack_00000018);
  local_70 = (uint *)__gnu_cxx::
                     __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     ::operator+(&local_78,1);
  splice_vector<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (&this->line_offsets,uVar4,uVar2,local_58,(const_iterator)local_70);
  uVar6 = deletion_extent_local.row;
  uVar5 = deletion_extent_local.row + 1;
  PVar8 = TextSlice::extent((TextSlice *)&__flags);
  uVar2 = local_24;
  inserted_line_offsets_delta._0_4_ = PVar8.row;
  uVar6 = uVar6 + (uint)inserted_line_offsets_delta + 1;
  sVar9 = TextSlice::start_offset((TextSlice *)&__flags);
  for (uStack_a0 = (ulong)uVar5; uStack_a0 < uVar6; uStack_a0 = uStack_a0 + 1) {
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&this->line_offsets,uStack_a0);
    *pvVar10 = *pvVar10 + (uVar2 - (int)sVar9);
  }
  sVar7 = std::__cxx11::
          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::size
                    (&this->content);
  iter._M_current = (uint *)((sVar7 & 0xffffffff) - (ulong)local_3c);
  local_c0._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->line_offsets);
  local_b8 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator+(&local_c0,(ulong)uVar6);
  while( true ) {
    local_c8._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->line_offsets);
    bVar3 = __gnu_cxx::operator!=(&local_b8,&local_c8);
    _Var1 = iter;
    if (!bVar3) break;
    puVar11 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator*(&local_b8);
    *puVar11 = *puVar11 + (int)_Var1._M_current;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_b8);
  }
  return CONCAT71(extraout_var,bVar3);
}

Assistant:

void Text::splice(Point start, Point deletion_extent, TextSlice inserted_slice) {
  uint32_t content_splice_start = offset_for_position(start);
  uint32_t content_splice_end = offset_for_position(start.traverse(deletion_extent));
  uint32_t original_content_size = content.size();
  splice_vector(
    content,
    content_splice_start,
    content_splice_end - content_splice_start,
    inserted_slice.begin(),
    inserted_slice.end()
  );

  splice_vector(
    line_offsets,
    start.row + 1,
    deletion_extent.row,
    inserted_slice.text->line_offsets.begin() + inserted_slice.start_position.row + 1,
    inserted_slice.text->line_offsets.begin() + inserted_slice.end_position.row + 1
  );

  uint32_t inserted_newlines_start = start.row + 1;
  uint32_t inserted_newlines_end = start.row + inserted_slice.extent().row + 1;
  int64_t inserted_line_offsets_delta = content_splice_start - static_cast<int64_t>(inserted_slice.start_offset());
  for (size_t i = inserted_newlines_start; i < inserted_newlines_end; i++) {
    line_offsets[i] += inserted_line_offsets_delta;
  }

  uint32_t content_size = content.size();
  int64_t trailing_line_offsets_delta = static_cast<int64_t>(content_size) - original_content_size;
  for (auto iter = line_offsets.begin() + inserted_newlines_end; iter != line_offsets.end(); ++iter) {
    *iter += trailing_line_offsets_delta;
  }
}